

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_suite::test_clear(void)

{
  undefined4 local_ac;
  size_type local_a8;
  undefined4 local_9c;
  size_type local_98;
  undefined4 local_8c;
  size_type local_88 [2];
  undefined1 local_78 [8];
  covariance<double,_4> filter;
  
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_88[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_8c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x15c,"void double_suite::test_clear()",local_88,&local_8c);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,0.0,0.0);
  local_98 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_9c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x15e,"void double_suite::test_clear()",&local_98,&local_9c);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::clear
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_a8 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::size
                       ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x160,"void double_suite::test_clear()",&local_a8,&local_ac);
  return;
}

Assistant:

void test_clear()
{
    window::covariance<double, 4> filter;
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(0.0, 0.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
}